

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heterogeneous_queue_basic_tests.cpp
# Opt level: O2

void density_tests::
     NbQueueBasicTests<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
     ::lf_heterogeneous_queue_basic_polymorphic_base_tests(void)

{
  int iVar1;
  bool bVar2;
  LfHeterQueue<RunTimeType> queue;
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  local_200;
  consume_operation local_178;
  reentrant_consume_operation local_160;
  consume_operation local_148;
  reentrant_consume_operation local_130;
  consume_operation local_118;
  PolymorphicBase local_100;
  reentrant_consume_operation local_e0;
  consume_operation local_c8;
  reentrant_consume_operation local_b0;
  consume_operation local_98;
  reentrant_consume_operation local_80 [4];
  
  local_200.
  super_LFQueue_Head<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
  .
  super_LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  .m_tail = 0xffc0;
  local_200.
  super_LFQueue_Head<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
  .
  super_LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_200.
  super_LFQueue_Head<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
  .m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_100.m_double = 0.0;
  local_100._24_8_ = 0;
  local_100._vptr_PolymorphicBase = (_func_int **)0x0;
  local_100.super_NonPolymorphicBase = (NonPolymorphicBase)0x0;
  PolymorphicBase::PolymorphicBase(&local_100);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
  ::emplace<density_tests::PolymorphicBase,density_tests::PolymorphicBase>
            ((lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
              *)&local_200,&local_100);
  PolymorphicBase::~PolymorphicBase(&local_100);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::emplace<density_tests::SingleDerived>(&local_200);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::emplace<density_tests::Derived1>(&local_200);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::emplace<density_tests::Derived2>(&local_200);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::emplace<density_tests::MultipleDerived>(&local_200);
  NbQueueBasicTests<(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
  ::
  dynamic_push_3<density_tests::PolymorphicBase,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>>
            (&local_200);
  NbQueueBasicTests<(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
  ::
  dynamic_push_3<density_tests::SingleDerived,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>>
            (&local_200);
  NbQueueBasicTests<(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
  ::
  dynamic_push_3<density_tests::Derived1,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>>
            (&local_200);
  NbQueueBasicTests<(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
  ::
  dynamic_push_3<density_tests::Derived2,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>>
            (&local_200);
  NbQueueBasicTests<(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
  ::
  dynamic_push_3<density_tests::MultipleDerived,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>>
            (&local_200);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::try_start_consume(&local_118,&local_200);
  polymorphic_consume<density_tests::PolymorphicBase,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>::consume_operation>
            (&local_118);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::consume_operation::~consume_operation(&local_118);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::try_start_reentrant_consume(&local_130,&local_200);
  polymorphic_consume<density_tests::SingleDerived,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>::reentrant_consume_operation>
            (&local_130);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_130);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::try_start_consume(&local_148,&local_200);
  polymorphic_consume<density_tests::Derived1,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>::consume_operation>
            (&local_148);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::consume_operation::~consume_operation(&local_148);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::try_start_reentrant_consume(&local_160,&local_200);
  polymorphic_consume<density_tests::Derived2,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>::reentrant_consume_operation>
            (&local_160);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_160);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::try_start_consume(&local_178,&local_200);
  polymorphic_consume<density_tests::MultipleDerived,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>::consume_operation>
            (&local_178);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::consume_operation::~consume_operation(&local_178);
  iVar1 = 3;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::try_start_reentrant_consume(local_80,&local_200);
    polymorphic_consume<density_tests::PolymorphicBase,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>::reentrant_consume_operation>
              (local_80);
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::reentrant_consume_operation::~reentrant_consume_operation(local_80);
  }
  iVar1 = 3;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::try_start_consume(&local_98,&local_200);
    polymorphic_consume<density_tests::SingleDerived,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>::consume_operation>
              (&local_98);
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::consume_operation::~consume_operation(&local_98);
  }
  iVar1 = 3;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::try_start_reentrant_consume(&local_b0,&local_200);
    polymorphic_consume<density_tests::Derived1,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>::reentrant_consume_operation>
              (&local_b0);
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::reentrant_consume_operation::~reentrant_consume_operation(&local_b0);
  }
  iVar1 = 3;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::try_start_consume(&local_c8,&local_200);
    polymorphic_consume<density_tests::Derived2,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>::consume_operation>
              (&local_c8);
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::consume_operation::~consume_operation(&local_c8);
  }
  iVar1 = 3;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::try_start_reentrant_consume(&local_e0,&local_200);
    polymorphic_consume<density_tests::MultipleDerived,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>::reentrant_consume_operation>
              (&local_e0);
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::reentrant_consume_operation::~reentrant_consume_operation(&local_e0);
  }
  bVar2 = density::
          lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::empty(&local_200);
  if (!bVar2) {
    detail::assert_failed<>
              ("queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/lf_heterogeneous_queue_basic_tests.cpp"
               ,0xcd);
  }
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::~lf_heter_queue(&local_200);
  return;
}

Assistant:

static void lf_heterogeneous_queue_basic_polymorphic_base_tests()
        {
            using namespace density;

            using RunTimeType = runtime_type<
              f_default_construct,
              f_move_construct,
              f_copy_construct,
              f_destroy,
              f_size,
              f_alignment>;
            LfHeterQueue<RunTimeType> queue;

            queue.push(PolymorphicBase());
            queue.template emplace<SingleDerived>();
            queue.template emplace<Derived1>();
            queue.template emplace<Derived2>();
            queue.template emplace<MultipleDerived>();

            dynamic_push_3<PolymorphicBase>(queue);
            dynamic_push_3<SingleDerived>(queue);
            dynamic_push_3<Derived1>(queue);
            dynamic_push_3<Derived2>(queue);
            dynamic_push_3<MultipleDerived>(queue);

            polymorphic_consume<PolymorphicBase>(queue.try_start_consume());
            polymorphic_consume<SingleDerived>(queue.try_start_reentrant_consume());
            polymorphic_consume<Derived1>(queue.try_start_consume());
            polymorphic_consume<Derived2>(queue.try_start_reentrant_consume());
            polymorphic_consume<MultipleDerived>(queue.try_start_consume());

            for (int i = 0; i < 3; i++)
                polymorphic_consume<PolymorphicBase>(queue.try_start_reentrant_consume());
            for (int i = 0; i < 3; i++)
                polymorphic_consume<SingleDerived>(queue.try_start_consume());
            for (int i = 0; i < 3; i++)
                polymorphic_consume<Derived1>(queue.try_start_reentrant_consume());
            for (int i = 0; i < 3; i++)
                polymorphic_consume<Derived2>(queue.try_start_consume());
            for (int i = 0; i < 3; i++)
                polymorphic_consume<MultipleDerived>(queue.try_start_reentrant_consume());

            DENSITY_TEST_ASSERT(queue.empty());
        }